

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationSingleQueueTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::synchronization::anon_unknown_2::EventTestInstance::iterate
          (TestStatus *__return_storage_ptr__,EventTestInstance *this)

{
  VkImageSubresourceRange *pVVar1;
  VkAccessFlags *pVVar2;
  ResourceType type;
  Operation *pOVar3;
  Resource *pRVar4;
  long *plVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  VkEvent obj;
  undefined8 commandBuffer;
  bool bVar8;
  deUint32 queueFamilyIndex;
  uint uVar9;
  int iVar10;
  DeviceInterface *vk;
  VkDevice device;
  VkAccessFlags srcAccessMask;
  VkAccessFlags dstAccessMask;
  undefined4 extraout_var;
  VkImageLayout oldLayout;
  VkImageLayout newLayout;
  void *__s1;
  void *__s2;
  VkBufferMemoryBarrier barrier;
  VkStructureType local_a8 [2];
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_a0;
  VkQueue local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  deUint32 local_68;
  VkCommandPool local_58;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_50;
  
  vk = Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context);
  local_80 = Context::getUniversalQueue((this->super_BaseTestInstance).super_TestInstance.m_context)
  ;
  queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_BaseTestInstance).super_TestInstance.m_context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&barrier,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  local_58.m_internal = barrier._0_8_;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&barrier,vk,device,(VkCommandPool)barrier._0_8_
                   );
  commandBuffer = barrier._0_8_;
  plVar5 = (long *)CONCAT44(barrier.pNext._4_4_,barrier.pNext._0_4_);
  uVar6 = CONCAT44(barrier.dstAccessMask,barrier.srcAccessMask);
  uVar7 = CONCAT44(barrier.dstQueueFamilyIndex,barrier.srcQueueFamilyIndex);
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&barrier,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_a0.m_device._0_4_ = barrier.srcAccessMask;
  DStack_a0.m_device._4_4_ = barrier.dstAccessMask;
  DStack_a0.m_allocator._0_4_ = barrier.srcQueueFamilyIndex;
  DStack_a0.m_allocator._4_4_ = barrier.dstQueueFamilyIndex;
  local_a8[0] = barrier.sType;
  local_a8[1] = barrier._4_4_;
  DStack_a0.m_deviceIface._0_4_ = barrier.pNext._0_4_;
  DStack_a0.m_deviceIface._4_4_ = barrier.pNext._4_4_;
  uVar9 = (*((this->super_BaseTestInstance).m_writeOp.
             super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
             .m_data.ptr)->_vptr_Operation[3])();
  iVar10 = (*((this->super_BaseTestInstance).m_readOp.
              super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              .m_data.ptr)->_vptr_Operation[3])();
  beginCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
  pOVar3 = (this->super_BaseTestInstance).m_writeOp.
           super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           .m_data.ptr;
  (*pOVar3->_vptr_Operation[2])(pOVar3,commandBuffer);
  (*vk->_vptr_DeviceInterface[0x6a])
            (vk,commandBuffer,CONCAT44(local_a8[1],local_a8[0]),(ulong)uVar9);
  type = ((this->super_BaseTestInstance).m_resource.
          super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
          .m_data.ptr)->m_type;
  if (type != RESOURCE_TYPE_BUFFER) {
    bVar8 = isIndirectBuffer(type);
    if (!bVar8) {
      pRVar4 = (this->super_BaseTestInstance).m_resource.
               super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
               .m_data.ptr;
      if (pRVar4->m_type == RESOURCE_TYPE_IMAGE) {
        local_68 = (pRVar4->m_imageData).subresourceRange.layerCount;
        pVVar1 = &(pRVar4->m_imageData).subresourceRange;
        local_78._0_4_ = pVVar1->aspectMask;
        local_78._4_4_ = pVVar1->baseMipLevel;
        uStack_70._0_4_ = (pRVar4->m_imageData).subresourceRange.levelCount;
        uStack_70._4_4_ = (pRVar4->m_imageData).subresourceRange.baseArrayLayer;
        makeImageMemoryBarrier
                  ((VkImageMemoryBarrier *)&barrier,srcAccessMask,dstAccessMask,oldLayout,newLayout,
                   (VkImage)(pRVar4->m_imageData).handle.m_internal,*pVVar1);
        (*vk->_vptr_DeviceInterface[0x6c])
                  (vk,commandBuffer,1,local_a8,(ulong)uVar9,iVar10,0,0,0,0,1,&barrier);
      }
      goto LAB_007d0bf1;
    }
  }
  pRVar4 = (this->super_BaseTestInstance).m_resource.
           super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
           .m_data.ptr;
  makeBufferMemoryBarrier
            (&barrier,srcAccessMask,dstAccessMask,(VkBuffer)(pRVar4->m_bufferData).handle.m_internal
             ,(pRVar4->m_bufferData).offset,(pRVar4->m_bufferData).size);
  (*vk->_vptr_DeviceInterface[0x6c])
            (vk,commandBuffer,1,local_a8,(ulong)uVar9,iVar10,0,0,1,&barrier,0,0);
LAB_007d0bf1:
  pOVar3 = (this->super_BaseTestInstance).m_readOp.
           super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           .m_data.ptr;
  (*pOVar3->_vptr_Operation[2])(pOVar3,commandBuffer);
  endCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
  submitCommandsAndWait(vk,device,local_80,(VkCommandBuffer)commandBuffer);
  iVar10 = (*((this->super_BaseTestInstance).m_writeOp.
              super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
              .m_data.ptr)->_vptr_Operation[4])();
  (*((this->super_BaseTestInstance).m_readOp.
     super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
     .m_data.ptr)->_vptr_Operation[4])();
  iVar10 = bcmp(__s1,__s2,CONCAT44(extraout_var,iVar10));
  pVVar2 = &barrier.srcAccessMask;
  barrier._0_8_ = pVVar2;
  if (iVar10 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&barrier,"OK","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,barrier._0_8_,
               CONCAT44(barrier.pNext._4_4_,barrier.pNext._0_4_) + barrier._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&barrier,"Memory contents don\'t match","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,barrier._0_8_,
               CONCAT44(barrier.pNext._4_4_,barrier.pNext._0_4_) + barrier._0_8_);
  }
  if ((VkAccessFlags *)barrier._0_8_ != pVVar2) {
    operator_delete((void *)barrier._0_8_,CONCAT44(barrier.dstAccessMask,barrier.srcAccessMask) + 1)
    ;
  }
  obj.m_internal._4_4_ = local_a8[1];
  obj.m_internal._0_4_ = local_a8[0];
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_a0,obj);
  }
  if (commandBuffer != 0) {
    barrier._0_8_ = commandBuffer;
    (**(code **)(*plVar5 + 0x240))(plVar5,uVar6,uVar7,1);
  }
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_50,local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					device				= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
		const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));
		const Unique<VkEvent>			event				(createEvent(vk, device));
		const SyncInfo					writeSync			= m_writeOp->getSyncInfo();
		const SyncInfo					readSync			= m_readOp->getSyncInfo();

		beginCommandBuffer(vk, *cmdBuffer);

		m_writeOp->recordCommands(*cmdBuffer);
		vk.cmdSetEvent(*cmdBuffer, *event, writeSync.stageMask);

		if (m_resource->getType() == RESOURCE_TYPE_BUFFER || isIndirectBuffer(m_resource->getType()))
		{
			const VkBufferMemoryBarrier barrier = makeBufferMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				m_resource->getBuffer().handle, m_resource->getBuffer().offset, m_resource->getBuffer().size);
			vk.cmdWaitEvents(*cmdBuffer, 1u, &event.get(), writeSync.stageMask, readSync.stageMask, 0u, DE_NULL, 1u, &barrier, 0u, DE_NULL);
		}
		else if (m_resource->getType() == RESOURCE_TYPE_IMAGE)
		{
			const VkImageMemoryBarrier barrier =  makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
				writeSync.imageLayout, readSync.imageLayout, m_resource->getImage().handle, m_resource->getImage().subresourceRange);
			vk.cmdWaitEvents(*cmdBuffer, 1u, &event.get(), writeSync.stageMask, readSync.stageMask, 0u, DE_NULL, 0u, DE_NULL, 1u, &barrier);
		}

		m_readOp->recordCommands(*cmdBuffer);

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		{
			const Data	expected = m_writeOp->getData();
			const Data	actual	 = m_readOp->getData();

			if (0 != deMemCmp(expected.data, actual.data, expected.size))
				return tcu::TestStatus::fail("Memory contents don't match");
		}

		return tcu::TestStatus::pass("OK");
	}